

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

dictionary * dic_new(int initial_size)

{
  dictionary *pdVar1;
  keynode **ppkVar2;
  dictionary *dic;
  int initial_size_local;
  
  pdVar1 = (dictionary *)malloc(0x28);
  dic._4_4_ = initial_size;
  if (initial_size == 0) {
    dic._4_4_ = 0x400;
  }
  pdVar1->length = dic._4_4_;
  pdVar1->count = 0;
  ppkVar2 = (keynode **)calloc(8,(long)dic._4_4_);
  pdVar1->table = ppkVar2;
  pdVar1->growth_treshold = 2.0;
  pdVar1->growth_factor = 10.0;
  return pdVar1;
}

Assistant:

struct dictionary* dic_new(int initial_size) {
	struct dictionary* dic = malloc(sizeof(struct dictionary));
	if (initial_size == 0) initial_size = 1024;
	dic->length = initial_size;
	dic->count = 0;
	dic->table = calloc(sizeof(struct keynode*), initial_size);
	dic->growth_treshold = 2.0;
	dic->growth_factor = 10;
	return dic;
}